

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 sqlite3IsTrueOrFalse(char *zIn)

{
  int iVar1;
  u32 uVar2;
  
  iVar1 = sqlite3StrICmp(zIn,"true");
  if (iVar1 == 0) {
    uVar2 = 0x10000000;
  }
  else {
    iVar1 = sqlite3StrICmp(zIn,"false");
    uVar2 = (uint)(iVar1 == 0) << 0x1d;
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3IsTrueOrFalse(const char *zIn){
  if( sqlite3StrICmp(zIn, "true")==0  ) return EP_IsTrue;
  if( sqlite3StrICmp(zIn, "false")==0 ) return EP_IsFalse;
  return 0;
}